

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

int nn_poll(nn_pollfd *fds,int nfds,int timeout)

{
  ushort uVar1;
  int iVar2;
  pollfd *__fds;
  ulong uVar3;
  int *piVar4;
  undefined8 uVar5;
  ulong uVar6;
  int iVar7;
  nfds_t __nfds;
  bool bVar8;
  int fd;
  size_t sz;
  ulong local_40;
  int local_34;
  
  uVar3 = (ulong)(uint)nfds;
  __fds = (pollfd *)nn_alloc_((long)nfds << 4);
  if (__fds == (pollfd *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/poll.c"
            ,0x8e);
  }
  else {
    uVar6 = 0;
    iVar7 = 0;
    local_40 = uVar3;
    local_34 = timeout;
    while( true ) {
      __nfds = (nfds_t)iVar7;
      if (uVar3 == uVar6) {
        iVar7 = poll(__fds,__nfds,local_34);
        if (iVar7 < 1) {
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          nn_free(__fds);
          *piVar4 = iVar2;
        }
        else {
          iVar2 = 0;
          iVar7 = 0;
          for (uVar3 = 0; local_40 != uVar3; uVar3 = uVar3 + 1) {
            fds[uVar3].revents = 0;
            if ((fds[uVar3].events & 1U) == 0) {
              uVar1 = 0;
            }
            else {
              bVar8 = (__fds[iVar2].revents & 1) != 0;
              if (bVar8) {
                fds[uVar3].revents = 1;
              }
              uVar1 = (ushort)bVar8;
              iVar2 = iVar2 + 1;
            }
            if ((fds[uVar3].events & 2U) != 0) {
              if ((__fds[iVar2].revents & 1) != 0) {
                uVar1 = uVar1 | 2;
                fds[uVar3].revents = uVar1;
              }
              iVar2 = iVar2 + 1;
            }
            iVar7 = (iVar7 + 1) - (uint)(uVar1 == 0);
          }
          nn_free(__fds);
        }
        return iVar7;
      }
      uVar1 = fds[uVar6].events;
      if ((uVar1 & 1) != 0) break;
LAB_001120a8:
      if ((uVar1 & 2) != 0) {
        sz = 4;
        iVar2 = nn_getsockopt(fds[uVar6].fd,0,10,&fd,&sz);
        if (iVar2 < 0) {
LAB_001121a1:
          nn_free(__fds);
          piVar4 = __errno_location();
          *piVar4 = -iVar2;
          return -1;
        }
        if (sz != 4) {
          uVar5 = 0xa6;
          goto LAB_00112205;
        }
        __fds[iVar7].fd = fd;
        __fds[iVar7].events = 1;
        iVar7 = iVar7 + 1;
        uVar3 = local_40;
      }
      uVar6 = uVar6 + 1;
    }
    sz = 4;
    iVar2 = nn_getsockopt(fds[uVar6].fd,0,0xb,&fd,&sz);
    if (iVar2 < 0) goto LAB_001121a1;
    if (sz == 4) {
      __fds[__nfds].fd = fd;
      __fds[__nfds].events = 1;
      iVar7 = iVar7 + 1;
      uVar1 = fds[uVar6].events;
      uVar3 = local_40;
      goto LAB_001120a8;
    }
    uVar5 = 0x99;
LAB_00112205:
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (fd)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/core/poll.c"
            ,uVar5);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_poll (struct nn_pollfd *fds, int nfds, int timeout)
{
    int rc;
    int i;
    int pos;
    int fd;
    int res;
    size_t sz;
    struct pollfd *pfd;

    /*  Construct a pollset to be used with OS-level 'poll' function. */
    pfd = nn_alloc (sizeof (struct pollfd) * nfds * 2, "pollset");
    alloc_assert (pfd);
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        if (fds [i].events & NN_POLLIN) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_RCVFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                errno = -rc;
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_SNDFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                errno = -rc;
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
    }    

    /*  Do the polling itself. */
    rc = poll (pfd, pos, timeout);
    if (nn_slow (rc <= 0)) {
        res = errno;
        nn_free (pfd);
        errno = res;
        return rc;
    }

    /*  Move the results from OS-level poll to nn_poll's pollset. */
    res = 0;
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        fds [i].revents = 0;
        if (fds [i].events & NN_POLLIN) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLOUT;
            ++pos;
        }
        if (fds [i].revents)
            ++res;
    }

    nn_free (pfd);
    return res;
}